

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

Name wasm::getBinaryFuncName(Binary *curr)

{
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  IString IVar1;
  Binary *curr_local;
  char *local_10;
  
  switch(curr->op) {
  case DivSInt32:
    str_00.str._M_str = DAT_027e5e58;
    str_00.str._M_len = I32S_DIV;
    Name::Name((Name *)&curr_local,str_00);
    break;
  case DivUInt32:
    str.str._M_str = DAT_027e5e68;
    str.str._M_len = I32U_DIV;
    Name::Name((Name *)&curr_local,str);
    break;
  case RemSInt32:
    str_02.str._M_str = DAT_027e5e78;
    str_02.str._M_len = I32S_REM;
    Name::Name((Name *)&curr_local,str_02);
    break;
  case RemUInt32:
    str_01.str._M_str = DAT_027e5e88;
    str_01.str._M_len = I32U_REM;
    Name::Name((Name *)&curr_local,str_01);
    break;
  default:
    Name::Name((Name *)&curr_local);
    break;
  case DivSInt64:
    curr_local = I64S_DIV;
    local_10 = DAT_027e55f8;
    break;
  case DivUInt64:
    curr_local = I64U_DIV;
    local_10 = DAT_027e5608;
    break;
  case RemSInt64:
    curr_local = I64S_REM;
    local_10 = DAT_027e55d8;
    break;
  case RemUInt64:
    curr_local = I64U_REM;
    local_10 = DAT_027e55e8;
  }
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)curr_local;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name getBinaryFuncName(Binary* curr) {
  switch (curr->op) {
    case RemSInt32:
      return I32S_REM;
    case RemUInt32:
      return I32U_REM;
    case DivSInt32:
      return I32S_DIV;
    case DivUInt32:
      return I32U_DIV;
    case RemSInt64:
      return I64S_REM;
    case RemUInt64:
      return I64U_REM;
    case DivSInt64:
      return I64S_DIV;
    case DivUInt64:
      return I64U_DIV;
    default:
      return Name();
  }
}